

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O0

GainedMove __thiscall GainContainer::getBestMove(GainContainer *this,uint max_diff)

{
  GainedMove GVar1;
  int iVar2;
  uint uVar3;
  const_reference pvVar4;
  Move local_60;
  int *local_58;
  type_conflict *gain;
  type *cell;
  GainedCell local_40;
  GainedCell local_38;
  uint local_30;
  uint local_2c;
  int SndPartElems;
  int FstPartElems;
  PartId from_part;
  GainContainer *pGStack_20;
  uint max_diff_local;
  GainContainer *this_local;
  int local_c;
  
  FstPartElems = max_diff;
  pGStack_20 = this;
  pvVar4 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[](&this->buckets_,0);
  local_2c = GainBuckets::getNumElems(pvVar4);
  pvVar4 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[](&this->buckets_,1);
  local_30 = GainBuckets::getNumElems(pvVar4);
  uVar3 = local_2c - local_30;
  if ((int)uVar3 < 1) {
    uVar3 = -uVar3;
  }
  if (uVar3 < (uint)FstPartElems) {
    pvVar4 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[](&this->buckets_,0);
    local_38 = GainBuckets::getMaxGainedCell(pvVar4);
    iVar2 = local_38.second;
    pvVar4 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[](&this->buckets_,1);
    local_40 = GainBuckets::getMaxGainedCell(pvVar4);
    SndPartElems._3_1_ = iVar2 <= local_40.second;
  }
  else if ((int)local_30 < (int)local_2c) {
    SndPartElems._3_1_ = 0;
  }
  else if ((int)local_2c < (int)local_30) {
    SndPartElems._3_1_ = 1;
  }
  pvVar4 = std::vector<GainBuckets,_std::allocator<GainBuckets>_>::operator[]
                     (&this->buckets_,(ulong)(SndPartElems._3_1_ & 1));
  cell = (type *)GainBuckets::getMaxGainedCell(pvVar4);
  gain = (type_conflict *)std::get<0ul,unsigned_int,int>((pair<unsigned_int,_int> *)&cell);
  local_58 = std::get<1ul,unsigned_int,int>((pair<unsigned_int,_int> *)&cell);
  local_60.cell = *gain;
  local_60.src = (PartId)(SndPartElems._3_1_ & 1);
  local_60.dst = OppositePart((PartId)(SndPartElems._3_1_ & 1));
  std::pair<Move,_int>::pair<int_&,_true>
            ((pair<Move,_int> *)((long)&this_local + 4),&local_60,local_58);
  GVar1.second = local_c;
  GVar1.first = stack0xffffffffffffffec;
  return GVar1;
}

Assistant:

GainContainer::GainedMove GainContainer::getBestMove(unsigned max_diff) const {
  PartId from_part;
  int FstPartElems = buckets_[0].getNumElems(),
      SndPartElems = buckets_[1].getNumElems();
  if (std::abs(FstPartElems - SndPartElems) < max_diff)
    from_part = buckets_[0].getMaxGainedCell().second >
                buckets_[1].getMaxGainedCell().second ?
                0 : 1;
  else if (FstPartElems > SndPartElems)
    from_part = 0;
  else if (FstPartElems < SndPartElems)
    from_part = 1;
  auto [cell, gain] = buckets_[from_part].getMaxGainedCell();
  return GainedMove{{cell, from_part, OppositePart(from_part)}, gain};
}